

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qunicodetools.cpp
# Opt level: O3

void QUnicodeTools::Tailored::myanmarAttributes
               (Script script,char16_t *text,qsizetype from,qsizetype len,
               QCharAttributes *attributes)

{
  char16_t cVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  
  if (0 < len) {
    lVar3 = 0;
    do {
      lVar4 = lVar3 + from;
      lVar2 = 0;
      do {
        lVar6 = len + from;
        if (len + from <= lVar4) goto LAB_0033e79a;
        cVar1 = text[lVar4];
        if (cVar1 == L'\x200d') {
          uVar5 = 0x12;
        }
        else if (cVar1 == L'\x200c') {
          uVar5 = 9;
        }
        else if ((ushort)(cVar1 + L'\xefa0') < 0xffa0) {
          uVar5 = 0;
        }
        else {
          uVar5 = (ulong)*(ushort *)(mymrCharClasses + (ulong)((ushort)cVar1 & 0x7f) * 4);
        }
        lVar6 = lVar2 * 0x13;
        lVar2 = (long)(char)mymrStateTable[uVar5 + lVar6];
        lVar4 = lVar4 + 1;
      } while (-1 < lVar2);
      lVar6 = ~(ulong)(mymrStateTable[uVar5 + lVar6] != -1) + lVar4;
LAB_0033e79a:
      attributes[lVar3 + from] = (QCharAttributes)((byte)attributes[lVar3 + from] | 9);
      lVar4 = lVar6 - from;
      if (len <= lVar6 - from) {
        lVar4 = len;
      }
      lVar2 = lVar3 + 1;
      lVar3 = lVar2;
      if (lVar2 < lVar4) {
        do {
          attributes[lVar2 + from] = (QCharAttributes)((byte)attributes[lVar2 + from] & 0xfe);
          lVar2 = lVar2 + 1;
          lVar3 = lVar4;
        } while (lVar4 != lVar2);
      }
    } while (lVar3 < len);
  }
  return;
}

Assistant:

static void myanmarAttributes(QChar::Script script, const char16_t *text, qsizetype from, qsizetype len, QCharAttributes *attributes)
{
    qsizetype end = from + len;
    qsizetype i = 0;
    Q_UNUSED(script);
    attributes += from;
    while (i < len) {
    bool invalid;
    qsizetype boundary = myanmar_nextSyllableBoundary(text, from+i, end, &invalid) - from;

    attributes[i].graphemeBoundary = true;
    attributes[i].lineBreak = true;

    if (boundary > len-1)
            boundary = len;
    i++;
    while (i < boundary) {
        attributes[i].graphemeBoundary = false;
        ++i;
    }
    assert(i == boundary);
    }
}